

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O3

void __thiscall ASDCP::TimedText::FrameBuffer::~FrameBuffer(FrameBuffer *this)

{
  ~FrameBuffer(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~FrameBuffer() {}